

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_equation_units.cpp
# Opt level: O1

void __thiscall otherEqUnits_trits_Test::TestBody(otherEqUnits_trits_Test *this)

{
  precise_unit *in_RDX;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var1;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_01;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_03;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_04;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_05;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_06;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_07;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_09;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_10;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_12;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_13;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_15;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_16;
  double unaff_RBX;
  pointer *__ptr;
  char *pcVar2;
  AssertionResult AVar3;
  double unaff_retaddr;
  char *in_stack_00000008;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffffd8;
  AssertHelper local_20;
  char local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  units::convert<units::precise_unit,units::precise_unit>
            ((units *)units::precise::data::trit,1.0,(precise_unit *)units::precise::data::bit_s,
             in_RDX);
  AVar3 = testing::internal::DoubleNearPredFormat
                    ((char *)in_stack_ffffffffffffffd8._M_head_impl,(char *)0x136744,
                     in_stack_00000008,unaff_retaddr,unaff_RBX,(double)in_stack_fffffffffffffff0);
  _Var1._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       AVar3.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if (local_18 == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_equation_units.cpp"
               ,0x205,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    _Var1 = extraout_RDX.
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl;
    if (in_stack_ffffffffffffffd8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffffd8._M_head_impl + 8))();
      _Var1._M_head_impl = extraout_RDX_00;
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
    _Var1._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         extraout_RDX_01.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  units::convert<units::precise_unit,units::precise_unit>
            ((units *)units::precise::data::trit,6.0,(precise_unit *)units::precise::data::bit_s,
             (precise_unit *)_Var1._M_head_impl);
  AVar3 = testing::internal::DoubleNearPredFormat
                    ((char *)in_stack_ffffffffffffffd8._M_head_impl,(char *)0x136809,
                     in_stack_00000008,unaff_retaddr,unaff_RBX,(double)in_stack_fffffffffffffff0);
  _Var1._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       AVar3.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if (local_18 == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_equation_units.cpp"
               ,0x207,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    _Var1 = extraout_RDX_02.
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl;
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )in_stack_ffffffffffffffd8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffffd8._M_head_impl + 8))();
      _Var1._M_head_impl = extraout_RDX_03;
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
    _Var1._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         extraout_RDX_04.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  units::convert<units::precise_unit,units::precise_unit>
            ((units *)units::precise::data::trit,20.19,(precise_unit *)units::precise::data::bit_s,
             (precise_unit *)_Var1._M_head_impl);
  AVar3 = testing::internal::DoubleNearPredFormat
                    ((char *)in_stack_ffffffffffffffd8._M_head_impl,(char *)0x1368ce,
                     in_stack_00000008,unaff_retaddr,unaff_RBX,(double)in_stack_fffffffffffffff0);
  _Var1._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       AVar3.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if (local_18 == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_equation_units.cpp"
               ,0x209,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    _Var1 = extraout_RDX_05.
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl;
    if (in_stack_ffffffffffffffd8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffffd8._M_head_impl + 8))();
      _Var1._M_head_impl = extraout_RDX_06;
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
    _Var1._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         extraout_RDX_07.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  units::convert<units::precise_unit,units::precise_unit>
            ((units *)units::precise::data::trit,40.38,(precise_unit *)units::precise::data::digits,
             (precise_unit *)_Var1._M_head_impl);
  AVar3 = testing::internal::DoubleNearPredFormat
                    ((char *)in_stack_ffffffffffffffd8._M_head_impl,(char *)0x136993,
                     in_stack_00000008,unaff_retaddr,unaff_RBX,(double)in_stack_fffffffffffffff0);
  _Var1._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       AVar3.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if (local_18 == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_equation_units.cpp"
               ,0x20d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    _Var1 = extraout_RDX_08.
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl;
    if (in_stack_ffffffffffffffd8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffffd8._M_head_impl + 8))();
      _Var1._M_head_impl = extraout_RDX_09;
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
    _Var1._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         extraout_RDX_10.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  units::convert<units::precise_unit,units::precise_unit>
            ((units *)units::precise::data::bit_s,1.58496,(precise_unit *)units::precise::data::trit
             ,(precise_unit *)_Var1._M_head_impl);
  AVar3 = testing::internal::DoubleNearPredFormat
                    ((char *)in_stack_ffffffffffffffd8._M_head_impl,(char *)0x136a58,
                     in_stack_00000008,unaff_retaddr,unaff_RBX,(double)in_stack_fffffffffffffff0);
  _Var1._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       AVar3.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if (local_18 == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_equation_units.cpp"
               ,0x212,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    _Var1 = extraout_RDX_11.
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl;
    if (in_stack_ffffffffffffffd8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffffd8._M_head_impl + 8))();
      _Var1._M_head_impl = extraout_RDX_12;
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
    _Var1._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         extraout_RDX_13.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  units::convert<units::precise_unit,units::precise_unit>
            ((units *)units::precise::data::bit_s,9.5,(precise_unit *)units::precise::data::trit,
             (precise_unit *)_Var1._M_head_impl);
  AVar3 = testing::internal::DoubleNearPredFormat
                    ((char *)in_stack_ffffffffffffffd8._M_head_impl,(char *)0x136b1d,
                     in_stack_00000008,unaff_retaddr,unaff_RBX,(double)in_stack_fffffffffffffff0);
  _Var1._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       AVar3.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if (local_18 == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_equation_units.cpp"
               ,0x214,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    _Var1 = extraout_RDX_14.
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl;
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )in_stack_ffffffffffffffd8._M_head_impl !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffffd8._M_head_impl + 8))();
      _Var1._M_head_impl = extraout_RDX_15;
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
    _Var1._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         extraout_RDX_16.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  units::convert<units::precise_unit,units::precise_unit>
            ((units *)units::precise::data::digits,9.0,(precise_unit *)units::precise::data::trit,
             (precise_unit *)_Var1._M_head_impl);
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffffd8._M_head_impl,(char *)0x136be2,in_stack_00000008,
             unaff_retaddr,unaff_RBX,(double)in_stack_fffffffffffffff0);
  if (local_18 == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_equation_units.cpp"
               ,0x216,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )in_stack_ffffffffffffffd8._M_head_impl !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffffd8._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  return;
}

Assistant:

TEST(otherEqUnits, trits)
{
    EXPECT_NEAR(
        convert(1.0, precise::data::trit, precise::data::bit_s),
        1.58496,
        0.00001);
    EXPECT_NEAR(
        convert(6.0, precise::data::trit, precise::data::bit_s), 9.5, 0.01);
    EXPECT_NEAR(
        convert(20.19, precise::data::trit, precise::data::bit_s), 32.0, 0.01);
    EXPECT_NEAR(
        convert(40.38, precise::data::trit, precise::data::digits),
        19.27,
        0.01);

    EXPECT_NEAR(
        convert(1.58496, precise::data::bit_s, precise::data::trit),
        1.0,
        0.00001);
    EXPECT_NEAR(
        convert(9.5, precise::data::bit_s, precise::data::trit), 6.0, 0.01);
    EXPECT_NEAR(
        convert(9, precise::data::digits, precise::data::trit), 18.86, 0.01);
}